

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

void __thiscall Lowerer::LowerLdSlot(Lowerer *this,Instr *instr)

{
  code *pcVar1;
  bool bVar2;
  Opnd *opnd;
  undefined4 *puVar3;
  Opnd *newSrc;
  Opnd *srcNew;
  Opnd *srcOpnd;
  Instr *instr_local;
  Lowerer *this_local;
  
  opnd = IR::Instr::UnlinkSrc1(instr);
  if (opnd == (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x2b91,"(srcOpnd)","Expected src opnd on LdSlot");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  newSrc = CreateOpndForSlotAccess(this,opnd);
  IR::Opnd::Free(opnd,this->m_func);
  IR::Instr::SetSrc1(instr,newSrc);
  LowererMD::ChangeToAssign(instr);
  return;
}

Assistant:

void
Lowerer::LowerLdSlot(IR::Instr *instr)
{
    IR::Opnd * srcOpnd = instr->UnlinkSrc1();
    AssertMsg(srcOpnd, "Expected src opnd on LdSlot");
    IR::Opnd * srcNew = this->CreateOpndForSlotAccess(srcOpnd);
    srcOpnd->Free(this->m_func);

    instr->SetSrc1(srcNew);
        m_lowererMD.ChangeToAssign(instr);
    }